

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O0

void __thiscall
ScriptElement_CopyOperator_Test::ScriptElement_CopyOperator_Test
          (ScriptElement_CopyOperator_Test *this)

{
  ScriptElement_CopyOperator_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ScriptElement_CopyOperator_Test_0088de28;
  return;
}

Assistant:

TEST(ScriptElement, CopyOperator) {
  ScriptElement op_elem = ScriptElement(ScriptOperator::OP_NOP);
  ScriptElement copied_elem = op_elem;

  EXPECT_EQ(op_elem.GetType(), copied_elem.GetType());
  EXPECT_EQ(op_elem.GetOpCode(), copied_elem.GetOpCode());
  EXPECT_EQ(op_elem.GetBinaryData().GetBytes(),
            copied_elem.GetBinaryData().GetBytes());
  EXPECT_EQ(op_elem.GetNumber(), copied_elem.GetNumber());
  EXPECT_EQ(op_elem.GetData().GetBytes(), copied_elem.GetData().GetBytes());
  EXPECT_STREQ(op_elem.ToString().c_str(), copied_elem.ToString().c_str());
}